

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_group_decompress(secp256k1_fe *x)

{
  int iVar1;
  int iVar2;
  void *in_RDI;
  int res_odd;
  int res_even;
  secp256k1_ge ge_odd;
  secp256k1_ge ge_even;
  secp256k1_fe fex;
  secp256k1_fe *in_stack_ffffffffffffff38;
  secp256k1_fe *in_stack_ffffffffffffff40;
  secp256k1_fe sStack_b8;
  int local_90;
  int in_stack_ffffffffffffff74;
  secp256k1_fe *in_stack_ffffffffffffff78;
  secp256k1_ge *in_stack_ffffffffffffff80;
  secp256k1_fe sStack_60;
  int local_38;
  secp256k1_fe local_30;
  
  memcpy(&local_30,in_RDI,0x28);
  secp256k1_fe_impl_normalize_var(&local_30);
  iVar1 = secp256k1_ge_set_xo_var
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  iVar2 = secp256k1_ge_set_xo_var
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  if (iVar1 != iVar2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x101e,"test condition failed: res_even == res_odd");
    abort();
  }
  if (iVar1 != 0) {
    secp256k1_fe_impl_normalize_var((secp256k1_fe *)&stack0xffffffffffffff20);
    secp256k1_fe_impl_normalize_var((secp256k1_fe *)&stack0xffffffffffffff78);
    secp256k1_fe_impl_normalize_var(&sStack_b8);
    secp256k1_fe_impl_normalize_var(&sStack_60);
    if (local_38 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x1027,"test condition failed: !ge_even.infinity");
      abort();
    }
    if (local_90 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x1028,"test condition failed: !ge_odd.infinity");
      abort();
    }
    iVar1 = secp256k1_fe_equal(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x102b,"test condition failed: secp256k1_fe_equal(&ge_even.x, x)");
      abort();
    }
    iVar1 = secp256k1_fe_equal(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x102c,"test condition failed: secp256k1_fe_equal(&ge_odd.x, x)");
      abort();
    }
    iVar1 = secp256k1_fe_impl_is_odd(&sStack_b8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x102f,"test condition failed: secp256k1_fe_is_odd(&ge_odd.y)");
      abort();
    }
    iVar1 = secp256k1_fe_impl_is_odd(&sStack_60);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x1030,"test condition failed: !secp256k1_fe_is_odd(&ge_even.y)");
      abort();
    }
  }
  return;
}

Assistant:

static void test_group_decompress(const secp256k1_fe* x) {
    /* The input itself, normalized. */
    secp256k1_fe fex = *x;
    /* Results of set_xo_var(..., 0), set_xo_var(..., 1). */
    secp256k1_ge ge_even, ge_odd;
    /* Return values of the above calls. */
    int res_even, res_odd;

    secp256k1_fe_normalize_var(&fex);

    res_even = secp256k1_ge_set_xo_var(&ge_even, &fex, 0);
    res_odd = secp256k1_ge_set_xo_var(&ge_odd, &fex, 1);

    CHECK(res_even == res_odd);

    if (res_even) {
        secp256k1_fe_normalize_var(&ge_odd.x);
        secp256k1_fe_normalize_var(&ge_even.x);
        secp256k1_fe_normalize_var(&ge_odd.y);
        secp256k1_fe_normalize_var(&ge_even.y);

        /* No infinity allowed. */
        CHECK(!ge_even.infinity);
        CHECK(!ge_odd.infinity);

        /* Check that the x coordinates check out. */
        CHECK(secp256k1_fe_equal(&ge_even.x, x));
        CHECK(secp256k1_fe_equal(&ge_odd.x, x));

        /* Check odd/even Y in ge_odd, ge_even. */
        CHECK(secp256k1_fe_is_odd(&ge_odd.y));
        CHECK(!secp256k1_fe_is_odd(&ge_even.y));
    }
}